

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O3

ostream * ApprovalTests::operator<<(ostream *os,Storyboard *board)

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  ::std::__cxx11::stringbuf::str();
  ::std::__ostream_insert<char,std::char_traits<char>>(os,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Storyboard& board)
    {
        os << board.output_.str();
        return os;
    }